

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.cc
# Opt level: O2

char * leveldb::GetVarint64Ptr(char *p,char *limit,uint64_t *value)

{
  byte bVar1;
  uint32_t shift;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = 0;
  uVar3 = 0;
  while( true ) {
    if (0x3f < uVar2) {
      return (char *)0x0;
    }
    if (limit <= p) break;
    bVar1 = *p;
    if (-1 < (char)bVar1) {
      *value = (ulong)bVar1 << ((byte)uVar2 & 0x3f) | uVar3;
      return (char *)((byte *)p + 1);
    }
    p = (char *)((byte *)p + 1);
    uVar3 = uVar3 | (ulong)(bVar1 & 0x7f) << ((byte)uVar2 & 0x3f);
    uVar2 = uVar2 + 7;
  }
  return (char *)0x0;
}

Assistant:

const char* GetVarint64Ptr(const char* p, const char* limit, uint64_t* value) {
  uint64_t result = 0;
  for (uint32_t shift = 0; shift <= 63 && p < limit; shift += 7) {
    uint64_t byte = *(reinterpret_cast<const unsigned char*>(p));
    p++;
    if (byte & 128) {
      // More bytes are present
      result |= ((byte & 127) << shift);
    } else {
      result |= (byte << shift);
      *value = result;
      return reinterpret_cast<const char*>(p);
    }
  }
  return nullptr;
}